

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

int __thiscall FileEntryInfo::allocateEntity(FileEntryInfo *this,int sectorNum)

{
  bool bVar1;
  size_type sVar2;
  int sz;
  int sectorNum_local;
  FileEntryInfo *this_local;
  
  this->m_sectorNum = sectorNum;
  bVar1 = isFile(this);
  if (bVar1) {
    sVar2 = std::vector<Extent,_std::allocator<Extent>_>::size(&this->m_extents);
    if (sVar2 < 0x71) {
      this->m_sectorsUsed = 1;
    }
    else {
      sVar2 = std::vector<Extent,_std::allocator<Extent>_>::size(&this->m_extents);
      this->m_sectorsUsed = ((int)sVar2 + 10) / 0x7c + 1;
    }
  }
  else {
    this->m_sectorsUsed = 2;
  }
  return this->m_sectorsUsed;
}

Assistant:

int FileEntryInfo::allocateEntity(const int sectorNum)
{
    m_sectorNum = sectorNum;
    if (!isFile())
        m_sectorsUsed = 2;  // restriction here: amount of files/subdirs is limited by sector size.
    else if (m_extents.size() <= MAX_EXTENTS_IN_EXTFILE)
        m_sectorsUsed = 1;
    else
    {
        const int sz = static_cast<int>(m_extents.size() - 1 - MAX_EXTENTS_IN_EXTFILE);
        m_sectorsUsed = 1 + (sz + MAX_EXTENTS_IN_EXTCONT - 1) / MAX_EXTENTS_IN_EXTCONT;
    }
    return m_sectorsUsed;
}